

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

Moves * __thiscall
Bishop::GenerateMoves(Moves *__return_storage_ptr__,Bishop *this,Square *source,Position *pos)

{
  Board *board_00;
  Board *board;
  undefined1 local_58 [8];
  Move m;
  Position *pos_local;
  Square *source_local;
  Bishop *this_local;
  Moves *moves;
  
  m.m_PromoteTo._7_1_ = 0;
  Moves::Moves(__return_storage_ptr__);
  Move::Move((Move *)local_58,&this->super_Piece,source,source);
  board_00 = Position::GetBoard(pos);
  Moves::TryRayAttack(__return_storage_ptr__,(Move *)local_58,board_00,1,1);
  Moves::TryRayAttack(__return_storage_ptr__,(Move *)local_58,board_00,1,-1);
  Moves::TryRayAttack(__return_storage_ptr__,(Move *)local_58,board_00,-1,1);
  Moves::TryRayAttack(__return_storage_ptr__,(Move *)local_58,board_00,-1,-1);
  return __return_storage_ptr__;
}

Assistant:

Moves Bishop::GenerateMoves( const Square &source, const Position &pos ) const
{
    Moves moves;
    Move m( this, source, source );
    const Board &board = pos.GetBoard();

    moves.TryRayAttack( m, board, 1, 1 );
    moves.TryRayAttack( m, board, 1, -1 );
    moves.TryRayAttack( m, board, -1, 1 );
    moves.TryRayAttack( m, board, -1, -1 );

    return moves;
}